

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XML256TableTranscoder.cpp
# Opt level: O3

XMLSize_t __thiscall
xercesc_4_0::XML256TableTranscoder::transcodeFrom
          (XML256TableTranscoder *this,XMLByte *srcData,XMLSize_t srcCount,XMLCh *toFill,
          XMLSize_t maxChars,XMLSize_t *bytesEaten,uchar *charSizes)

{
  byte *pbVar1;
  XMLCh *pXVar2;
  
  if (srcCount < maxChars) {
    maxChars = srcCount;
  }
  if (0 < (long)maxChars) {
    pbVar1 = srcData + maxChars;
    pXVar2 = this->fFromTable;
    do {
      if (pXVar2[*srcData] != L'\xffff') {
        *toFill = pXVar2[*srcData];
        toFill = toFill + 1;
      }
      srcData = srcData + 1;
    } while (srcData < pbVar1);
  }
  *bytesEaten = maxChars;
  memset(charSizes,1,maxChars);
  return maxChars;
}

Assistant:

XMLSize_t
XML256TableTranscoder::transcodeFrom(const  XMLByte* const       srcData
                                    , const XMLSize_t            srcCount
                                    ,       XMLCh* const         toFill
                                    , const XMLSize_t            maxChars
                                    ,       XMLSize_t&           bytesEaten
                                    ,       unsigned char* const charSizes)
{
    //
    //  Calculate the max chars we can do here. Its the lesser of the
    //  max output chars and the number of chars in the source.
    //
    const XMLSize_t countToDo = srcCount < maxChars ? srcCount : maxChars;

    //
    //  Loop through the count we have to do and map each char via the
    //  lookup table.
    //
    const XMLByte*  srcPtr = srcData;
    const XMLByte*  endPtr = (srcPtr + countToDo);
    XMLCh*          outPtr = toFill;
    while (srcPtr < endPtr)
    {
        const XMLCh uniCh = fFromTable[*srcPtr++];
        if (uniCh != 0xFFFF)
        {
            *outPtr++ = uniCh;
            continue;
        }
    }


    // Set the bytes eaten
    bytesEaten = countToDo;

    // Set the character sizes to the fixed size
    memset(charSizes, 1, countToDo);

    // Return the chars we transcoded
    return countToDo;
}